

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_bra_32(m68k_info *info)

{
  m68k_info *in_RDI;
  m68k_info *unaff_retaddr;
  m68k_info *pmVar1;
  
  if ((in_RDI->type & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x385213);
  }
  else {
    pmVar1 = in_RDI;
    read_imm_32(in_RDI);
    build_relative_branch
              (unaff_retaddr,(int)((ulong)pmVar1 >> 0x20),(int)pmVar1,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

static void d68020_bra_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_relative_branch(info, M68K_INS_BRA, 4, read_imm_32(info));
}